

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyInstance::iterate
          (TestStatus *__return_storage_ptr__,FilteringAnisotropyInstance *this)

{
  int cellSize;
  bool bVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  NotSupportedError *this_00;
  TestTexture2D *pTVar3;
  int *piVar4;
  reference pvVar5;
  TestContext *pTVar6;
  TestLog *pTVar7;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  Vector<float,_4> local_478;
  ConstPixelBufferAccess local_468;
  ConstPixelBufferAccess local_440;
  int local_418;
  allocator<char> local_411;
  string local_410;
  ConstPixelBufferAccess local_3f0;
  ConstPixelBufferAccess local_3c8;
  Vector<float,_2> local_3a0;
  Vector<float,_2> local_398;
  undefined1 local_390 [8];
  vector<float,_std::allocator<float>_> texCoord;
  float position [16];
  undefined1 local_330 [8];
  Surface renderedAnisotropyFrame;
  Surface renderedFrame;
  Vector<float,_4> local_2f0;
  PixelBufferAccess local_2e0;
  int local_2b4;
  ConstPixelBufferAccess local_2b0;
  int local_284;
  int local_280;
  uint local_27c;
  int gridSize;
  int levelNdx;
  undefined1 local_270 [8];
  TestTexture2DSp texture;
  TextureRenderer renderer;
  FilteringAnisotropyInstance *this_local;
  
  pVVar2 = Context::getDeviceFeatures((this->super_TestInstance).m_context);
  if (pVVar2->samplerAnisotropy == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,
               "Skipping anisotropic tests since the device does not support anisotropic filtering."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringAnisotropyTests.cpp"
               ,0x68);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  util::TextureRenderer::TextureRenderer
            ((TextureRenderer *)&texture.m_state,(this->super_TestInstance).m_context,
             VK_SAMPLE_COUNT_1_BIT,0x80,0x80);
  pTVar3 = (TestTexture2D *)operator_new(0x70);
  _gridSize = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture2D::TestTexture2D(pTVar3,(TextureFormat *)&gridSize,0x80,0x80);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr
            ((SharedPtr<vkt::pipeline::TestTexture2D> *)local_270,pTVar3);
  for (local_27c = 0; (int)local_27c < (this->m_refParams).super_ReferenceParams.maxLevel + 1;
      local_27c = local_27c + 1) {
    pTVar3 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->
                       ((SharedPtr<vkt::pipeline::TestTexture2D> *)local_270);
    (*(pTVar3->super_TestTexture)._vptr_TestTexture[7])(&local_2b0,pTVar3,(ulong)local_27c,0);
    local_284 = tcu::ConstPixelBufferAccess::getHeight(&local_2b0);
    if (local_284 < 0) {
      local_284 = local_284 + 7;
    }
    local_284 = local_284 >> 3;
    local_2b4 = 1;
    piVar4 = std::max<int>(&local_284,&local_2b4);
    local_280 = *piVar4;
    pTVar3 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->
                       ((SharedPtr<vkt::pipeline::TestTexture2D> *)local_270);
    (*(pTVar3->super_TestTexture)._vptr_TestTexture[7])(&local_2e0,pTVar3,(ulong)local_27c,0);
    cellSize = local_280;
    tcu::Vector<float,_4>::Vector(&local_2f0,0.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderedFrame.m_pixels.m_cap,1.0);
    tcu::fillWithGrid(&local_2e0,cellSize,&local_2f0,(Vec4 *)&renderedFrame.m_pixels.m_cap);
  }
  util::TextureRenderer::setViewport((TextureRenderer *)&texture.m_state,0.0,0.0,128.0,128.0);
  util::TextureRenderer::add2DTexture
            ((TextureRenderer *)&texture.m_state,(TestTexture2DSp *)local_270);
  tcu::Surface::Surface((Surface *)&renderedAnisotropyFrame.m_pixels.m_cap,0x80,0x80);
  tcu::Surface::Surface((Surface *)local_330,0x80,0x80);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xbf800000c0600000;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_390);
  tcu::Vector<float,_2>::Vector(&local_398,0.0);
  tcu::Vector<float,_2>::Vector(&local_3a0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_390,&local_398,&local_3a0);
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_390,0);
  util::TextureRenderer::renderQuad
            ((TextureRenderer *)&texture.m_state,(Surface *)&renderedAnisotropyFrame.m_pixels.m_cap,
             (float *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0,pvVar5,
             &(this->m_refParams).super_ReferenceParams,1.0);
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_390,0);
  util::TextureRenderer::renderQuad
            ((TextureRenderer *)&texture.m_state,(Surface *)local_330,
             (float *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0,pvVar5,
             &(this->m_refParams).super_ReferenceParams,(this->m_refParams).maxAnisotropy);
  pTVar6 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&local_3c8,(Surface *)&renderedAnisotropyFrame.m_pixels.m_cap);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_3f0,(Surface *)local_330);
  bVar1 = tcu::fuzzyCompare(pTVar7,"Expecting comparison to pass","Expecting comparison to pass",
                            &local_3c8,&local_3f0,0.05,COMPARE_LOG_RESULT);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pTVar6 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar7 = tcu::TestContext::getLog(pTVar6);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_440,(Surface *)&renderedAnisotropyFrame.m_pixels.m_cap);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_468,(Surface *)local_330);
    tcu::Vector<float,_4>::Vector(&local_478,0.05);
    bVar1 = tcu::floatThresholdCompare
                      (pTVar7,"Expecting comparison to fail","Expecting comparison to fail",
                       &local_440,&local_468,&local_478,COMPARE_LOG_RESULT);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"Fail",&local_499);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      local_418 = 1;
    }
    else {
      local_418 = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Fail",&local_411);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    local_418 = 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_390);
  tcu::Surface::~Surface((Surface *)local_330);
  tcu::Surface::~Surface((Surface *)&renderedAnisotropyFrame.m_pixels.m_cap);
  if (local_418 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"Pass",&local_4c1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    local_418 = 1;
  }
  de::SharedPtr<vkt::pipeline::TestTexture2D>::~SharedPtr
            ((SharedPtr<vkt::pipeline::TestTexture2D> *)local_270);
  util::TextureRenderer::~TextureRenderer((TextureRenderer *)&texture.m_state);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate	(void)
	{
		// Check device for anisotropic filtering support
		if (!m_context.getDeviceFeatures().samplerAnisotropy)
			TCU_THROW(NotSupportedError, "Skipping anisotropic tests since the device does not support anisotropic filtering.");

		TextureRenderer	renderer	(m_context, VK_SAMPLE_COUNT_1_BIT, ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
		TestTexture2DSp	texture		= TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM), ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION));

		for (int levelNdx = 0; levelNdx < m_refParams.maxLevel + 1; levelNdx++)
		{
			const int gridSize = max(texture->getLevel(levelNdx, 0).getHeight() / 8, 1);
			tcu::fillWithGrid(texture->getLevel(levelNdx, 0), gridSize, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4(1.0f));
		}

		renderer.setViewport(0.0f, 0.0f, static_cast<float>(ANISOTROPY_TEST_RESOLUTION), static_cast<float>(ANISOTROPY_TEST_RESOLUTION));
		renderer.add2DTexture(texture);

		{
			Surface			renderedFrame			(ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
			Surface			renderedAnisotropyFrame	(ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
			const float		position[]				=
			{
				-3.5f, -1.0f, 0.0f, 3.5f,
				-3.5f, +1.0f, 0.0f, 1.0f,
				+3.5f, -1.0f, 0.0f, 3.5f,
				+3.5f, +1.0f, 0.0f, 1.0f
			};
			vector<float>	texCoord;

			computeQuadTexCoord2D(texCoord, Vec2(0.0f), Vec2(1.0f));

			renderer.renderQuad(renderedFrame,				position, 0, &texCoord[0], m_refParams, 1.0f);
			renderer.renderQuad(renderedAnisotropyFrame,	position, 0, &texCoord[0], m_refParams, m_refParams.maxAnisotropy);

			if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "Expecting comparison to pass", "Expecting comparison to pass",
					renderedFrame.getAccess(), renderedAnisotropyFrame.getAccess(), 0.05f, tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::fail("Fail");

			if (floatThresholdCompare (m_context.getTestContext().getLog(), "Expecting comparison to fail", "Expecting comparison to fail",
					renderedFrame.getAccess(), renderedAnisotropyFrame.getAccess(), Vec4(0.05f), tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::fail("Fail");
		}
		return tcu::TestStatus::pass("Pass");
	}